

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O3

void __thiscall Assimp::Blender::DNA::DumpToFile(DNA *this)

{
  pointer pSVar1;
  pointer pFVar2;
  Logger *pLVar3;
  ostream *poVar4;
  Field *ff;
  pointer pFVar5;
  Structure *s;
  pointer pSVar6;
  ofstream f;
  long local_230;
  undefined1 local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  ::std::ofstream::ofstream(&local_230,"dna.txt",_S_out);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"Field format: type name offset size",0x23);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"Structure format: name size",0x1b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
    pSVar6 = (this->structures).
             super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
             super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (this->structures).
             super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
             super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar6 != pSVar1) {
      do {
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,(pSVar6->name)._M_dataplus._M_p,
                            (pSVar6->name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
        pFVar2 = (pSVar6->fields).
                 super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
                 super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pFVar5 = (pSVar6->fields).
                      super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
                      super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                      ._M_impl.super__Vector_impl_data._M_start; pFVar5 != pFVar2;
            pFVar5 = pFVar5 + 1) {
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,(pFVar5->type)._M_dataplus._M_p,
                              (pFVar5->type)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,(pFVar5->name)._M_dataplus._M_p,(pFVar5->name)._M_string_length
                             );
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        }
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
        pSVar6 = pSVar6 + 1;
      } while (pSVar6 != pSVar1);
    }
    ::std::ostream::flush();
    pLVar3 = DefaultLogger::get();
    Logger::info(pLVar3,"BlenderDNA: Dumped dna to dna.txt");
  }
  else {
    pLVar3 = DefaultLogger::get();
    Logger::error(pLVar3,"Could not dump dna to dna.txt");
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __M_insert<long>;
  ::std::filebuf::~filebuf(local_228);
  ::std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void DNA :: DumpToFile()
{
    // we don't bother using the VFS here for this is only for debugging.
    // (and all your bases are belong to us).

    std::ofstream f("dna.txt");
    if (f.fail()) {
        ASSIMP_LOG_ERROR("Could not dump dna to dna.txt");
        return;
    }
    f << "Field format: type name offset size" << "\n";
    f << "Structure format: name size" << "\n";

    for(const Structure& s : structures) {
        f << s.name << " " << s.size << "\n\n";
        for(const Field& ff : s.fields) {
            f << "\t" << ff.type << " " << ff.name << " " << ff.offset << " " << ff.size << "\n";
        }
        f << "\n";
    }
    f << std::flush;

    ASSIMP_LOG_INFO("BlenderDNA: Dumped dna to dna.txt");
}